

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_Bools(archive_read *a,uchar *data,size_t num)

{
  byte *pbVar1;
  uint local_3c;
  uint local_38;
  uint avail;
  uint mask;
  uint i;
  uchar *p;
  size_t num_local;
  uchar *data_local;
  archive_read *a_local;
  
  local_38 = 0;
  local_3c = 0;
  avail = 0;
  do {
    if (num <= avail) {
      return 0;
    }
    if (local_38 == 0) {
      pbVar1 = header_bytes(a,1);
      if (pbVar1 == (byte *)0x0) {
        return -1;
      }
      local_3c = (uint)*pbVar1;
      local_38 = 0x80;
    }
    data[avail] = (local_3c & local_38) != 0;
    local_38 = local_38 >> 1;
    avail = avail + 1;
  } while( true );
}

Assistant:

static int
read_Bools(struct archive_read *a, unsigned char *data, size_t num)
{
	const unsigned char *p;
	unsigned i, mask = 0, avail = 0;

	for (i = 0; i < num; i++) {
		if (mask == 0) {
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			avail = *p;
			mask = 0x80;
		}
		data[i] = (avail & mask)?1:0;
		mask >>= 1;
	}
	return (0);
}